

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O1

Optimizer * __thiscall
spvtools::Optimizer::RegisterLegalizationPasses(Optimizer *this,bool preserve_interface)

{
  PassToken PVar1;
  PassToken local_120;
  PassToken local_118;
  PassToken local_110;
  PassToken local_108;
  PassToken local_100;
  PassToken local_f8;
  PassToken local_f0;
  PassToken local_e8;
  PassToken local_e0;
  PassToken local_d8;
  PassToken local_d0;
  PassToken local_c8;
  PassToken local_c0;
  PassToken local_b8;
  PassToken local_b0;
  PassToken local_a8;
  PassToken local_a0;
  PassToken local_98;
  PassToken local_90;
  PassToken local_88;
  PassToken local_80;
  PassToken local_78;
  PassToken local_70;
  PassToken local_68;
  PassToken local_60;
  PassToken local_58;
  PassToken local_50;
  PassToken local_48;
  PassToken local_40;
  spvtools local_38 [8];
  
  CreateWrapOpKillPass();
  RegisterPass(this,&local_60);
  CreateDeadBranchElimPass();
  RegisterPass(this,&local_68);
  CreateMergeReturnPass();
  RegisterPass(this,&local_70);
  CreateInlineExhaustivePass();
  RegisterPass(this,&local_78);
  CreateEliminateDeadFunctionsPass();
  RegisterPass(this,&local_80);
  CreatePrivateToLocalPass();
  RegisterPass(this,&local_88);
  CreateFixStorageClassPass();
  RegisterPass(this,&local_90);
  CreateLocalSingleBlockLoadStoreElimPass();
  RegisterPass(this,&local_98);
  CreateLocalSingleStoreElimPass();
  RegisterPass(this,&local_a0);
  CreateAggressiveDCEPass((spvtools *)&local_a8,preserve_interface);
  RegisterPass(this,&local_a8);
  CreateScalarReplacementPass((spvtools *)&local_b0,0);
  RegisterPass(this,&local_b0);
  CreateLocalSingleBlockLoadStoreElimPass();
  RegisterPass(this,&local_b8);
  CreateLocalSingleStoreElimPass();
  RegisterPass(this,&local_c0);
  CreateAggressiveDCEPass((spvtools *)&local_c8,preserve_interface);
  RegisterPass(this,&local_c8);
  CreateLocalMultiStoreElimPass();
  RegisterPass(this,&local_d0);
  CreateAggressiveDCEPass((spvtools *)&local_d8,preserve_interface);
  RegisterPass(this,&local_d8);
  CreateCCPPass();
  RegisterPass(this,&local_e0);
  CreateLoopUnrollPass((spvtools *)&local_e8,true,0);
  RegisterPass(this,&local_e8);
  CreateDeadBranchElimPass();
  RegisterPass(this,&local_f0);
  CreateSimplificationPass();
  RegisterPass(this,&local_f8);
  CreateAggressiveDCEPass((spvtools *)&local_100,preserve_interface);
  RegisterPass(this,&local_100);
  MakeUnique<spvtools::opt::CopyPropagateArrays>();
  local_108.impl_._M_t.
  super___uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl =
       (unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
        )operator_new(8);
  PVar1.impl_._M_t.
  super___uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl =
       local_120.impl_._M_t.
       super___uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
       .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl;
  local_120.impl_._M_t.
  super___uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl =
       (unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
        )(__uniq_ptr_data<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>,_true,_true>
          )0x0;
  *(unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
    *)local_108.impl_._M_t.
      super___uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
      .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl =
       PVar1.impl_._M_t.
       super___uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
       .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl;
  RegisterPass(this,&local_108);
  CreateVectorDCEPass();
  RegisterPass(this,&local_110);
  MakeUnique<spvtools::opt::DeadInsertElimPass>();
  local_118.impl_._M_t.
  super___uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl =
       (unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
        )operator_new(8);
  PVar1.impl_._M_t.
  super___uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl =
       local_120.impl_._M_t.
       super___uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
       .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl;
  local_120.impl_._M_t.
  super___uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl =
       (unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
        )(__uniq_ptr_data<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>,_true,_true>
          )0x0;
  *(unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
    *)local_118.impl_._M_t.
      super___uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
      .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl =
       PVar1.impl_._M_t.
       super___uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
       .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl;
  RegisterPass(this,&local_118);
  CreateReduceLoadSizePass((spvtools *)&local_120,0.9);
  RegisterPass(this,&local_120);
  CreateAggressiveDCEPass(local_38,preserve_interface);
  RegisterPass(this,(PassToken *)local_38);
  CreateRemoveUnusedInterfaceVariablesPass();
  RegisterPass(this,&local_40);
  CreateInterpolateFixupPass();
  RegisterPass(this,&local_48);
  CreateInvocationInterlockPlacementPass();
  RegisterPass(this,&local_50);
  CreateOpExtInstWithForwardReferenceFixupPass();
  RegisterPass(this,&local_58);
  PassToken::~PassToken(&local_58);
  PassToken::~PassToken(&local_50);
  PassToken::~PassToken(&local_48);
  PassToken::~PassToken(&local_40);
  PassToken::~PassToken((PassToken *)local_38);
  PassToken::~PassToken(&local_120);
  PassToken::~PassToken(&local_118);
  PassToken::~PassToken(&local_110);
  PassToken::~PassToken(&local_108);
  PassToken::~PassToken(&local_100);
  PassToken::~PassToken(&local_f8);
  PassToken::~PassToken(&local_f0);
  PassToken::~PassToken(&local_e8);
  PassToken::~PassToken(&local_e0);
  PassToken::~PassToken(&local_d8);
  PassToken::~PassToken(&local_d0);
  PassToken::~PassToken(&local_c8);
  PassToken::~PassToken(&local_c0);
  PassToken::~PassToken(&local_b8);
  PassToken::~PassToken(&local_b0);
  PassToken::~PassToken(&local_a8);
  PassToken::~PassToken(&local_a0);
  PassToken::~PassToken(&local_98);
  PassToken::~PassToken(&local_90);
  PassToken::~PassToken(&local_88);
  PassToken::~PassToken(&local_80);
  PassToken::~PassToken(&local_78);
  PassToken::~PassToken(&local_70);
  PassToken::~PassToken(&local_68);
  PassToken::~PassToken(&local_60);
  return this;
}

Assistant:

Optimizer& Optimizer::RegisterLegalizationPasses(bool preserve_interface) {
  return
      // Wrap OpKill instructions so all other code can be inlined.
      RegisterPass(CreateWrapOpKillPass())
          // Remove unreachable block so that merge return works.
          .RegisterPass(CreateDeadBranchElimPass())
          // Merge the returns so we can inline.
          .RegisterPass(CreateMergeReturnPass())
          // Make sure uses and definitions are in the same function.
          .RegisterPass(CreateInlineExhaustivePass())
          // Make private variable function scope
          .RegisterPass(CreateEliminateDeadFunctionsPass())
          .RegisterPass(CreatePrivateToLocalPass())
          // Fix up the storage classes that DXC may have purposely generated
          // incorrectly.  All functions are inlined, and a lot of dead code has
          // been removed.
          .RegisterPass(CreateFixStorageClassPass())
          // Propagate the value stored to the loads in very simple cases.
          .RegisterPass(CreateLocalSingleBlockLoadStoreElimPass())
          .RegisterPass(CreateLocalSingleStoreElimPass())
          .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
          // Split up aggregates so they are easier to deal with.
          .RegisterPass(CreateScalarReplacementPass(0))
          // Remove loads and stores so everything is in intermediate values.
          // Takes care of copy propagation of non-members.
          .RegisterPass(CreateLocalSingleBlockLoadStoreElimPass())
          .RegisterPass(CreateLocalSingleStoreElimPass())
          .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
          .RegisterPass(CreateLocalMultiStoreElimPass())
          .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
          // Propagate constants to get as many constant conditions on branches
          // as possible.
          .RegisterPass(CreateCCPPass())
          .RegisterPass(CreateLoopUnrollPass(true))
          .RegisterPass(CreateDeadBranchElimPass())
          // Copy propagate members.  Cleans up code sequences generated by
          // scalar replacement.  Also important for removing OpPhi nodes.
          .RegisterPass(CreateSimplificationPass())
          .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
          .RegisterPass(CreateCopyPropagateArraysPass())
          // May need loop unrolling here see
          // https://github.com/Microsoft/DirectXShaderCompiler/pull/930
          // Get rid of unused code that contain traces of illegal code
          // or unused references to unbound external objects
          .RegisterPass(CreateVectorDCEPass())
          .RegisterPass(CreateDeadInsertElimPass())
          .RegisterPass(CreateReduceLoadSizePass())
          .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
          .RegisterPass(CreateRemoveUnusedInterfaceVariablesPass())
          .RegisterPass(CreateInterpolateFixupPass())
          .RegisterPass(CreateInvocationInterlockPlacementPass())
          .RegisterPass(CreateOpExtInstWithForwardReferenceFixupPass());
}